

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O3

void __thiscall senjo::PerftCommandHandle::Execute(PerftCommandHandle *this)

{
  byte bVar1;
  ChessEngine *pCVar2;
  undefined1 *puVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  FILE *pFVar9;
  char *pcVar10;
  undefined4 extraout_var;
  int *piVar11;
  long lVar12;
  int iVar13;
  timeval *ptVar14;
  char cVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined4 uVar21;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  timeval tv;
  uint64_t nodes;
  uint64_t pcount;
  uint64_t qnodes;
  char fen [16384];
  char local_4091;
  timeval local_4090;
  FILE *local_4080;
  Output local_4078;
  uint64_t local_4070;
  uint64_t local_4068;
  uint64_t local_4060;
  double local_4058;
  double dStack_4050;
  long local_4040;
  timeval local_4038 [1024];
  
  pCVar2 = (this->super_BackgroundCommand).engine;
  if (pCVar2 == (ChessEngine *)0x0) {
    Output::Output((Output *)local_4038,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Engine not set for \'",0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(this->command)._M_dataplus._M_p,
               (this->command)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' command",9);
  }
  else {
    (*pCVar2->_vptr_ChessEngine[0x1e])();
    if ((this->fileName)._M_string_length == 0) {
      pCVar2 = (this->super_BackgroundCommand).engine;
      if (this->qperft == true) {
        ChessEngine::QPerft(pCVar2,this->maxDepth);
        return;
      }
      ChessEngine::Perft(pCVar2,this->maxDepth);
      return;
    }
    pFVar9 = fopen((this->fileName)._M_dataplus._M_p,"r");
    local_4080 = pFVar9;
    if (pFVar9 != (FILE *)0x0) {
      iVar8 = 0;
      gettimeofday(local_4038,(__timezone_ptr_t)0x0);
      lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_4038[0].tv_usec),8);
      local_4040 = CONCAT71(local_4038[0].tv_sec._1_7_,(char)local_4038[0].tv_sec);
      local_4058 = (double)((lVar12 >> 7) - (lVar12 >> 0x3f));
      local_4068 = 0;
      local_4070 = 0;
      local_4060 = 0;
      iVar13 = 1;
LAB_001419c5:
      pcVar10 = fgets((char *)local_4038,0x4000,pFVar9);
      if (pcVar10 != (char *)0x0) {
        cVar15 = (char)local_4038[0].tv_sec;
        local_4090.tv_sec = (__time_t)local_4038;
        if ((char)local_4038[0].tv_sec == '\0') {
          bVar6 = false;
        }
        else {
          do {
            ptVar14 = (timeval *)((long)(__time_t *)local_4090.tv_sec + 1);
            iVar7 = isspace((int)cVar15);
            pFVar9 = local_4080;
            if (iVar7 == 0) {
              if (cVar15 != '#') {
                iVar7 = iVar8 + 1;
                if (0 < this->skip && iVar8 < this->skip) {
                  bVar6 = false;
                  iVar8 = iVar7;
                  goto LAB_00141a29;
                }
                Output::Output(&local_4078,InfoPrefix);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(this->fileName)._M_dataplus._M_p,
                           (this->fileName)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," line ",6)
                ;
                std::ostream::operator<<((ostream *)&std::cout,iVar13);
                local_4091 = ' ';
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,&local_4091,1);
                Output::operator<<(&local_4078,(char **)&local_4090);
                Output::~Output(&local_4078);
                ptVar14 = (timeval *)local_4090.tv_sec;
                if ((timeval *)local_4090.tv_sec != (timeval *)0x0) goto LAB_00141ad8;
                goto LAB_00141b40;
              }
              break;
            }
            cVar15 = (char)ptVar14->tv_sec;
            local_4090.tv_sec = (__time_t)ptVar14;
          } while (cVar15 != '\0');
          bVar6 = false;
        }
        goto LAB_00141a29;
      }
      goto LAB_00141c85;
    }
    Output::Output((Output *)local_4038,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cannot open \'",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(this->fileName)._M_dataplus._M_p,
               (this->fileName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\': ",3);
    piVar11 = __errno_location();
    local_4090.tv_sec = (__time_t)strerror(*piVar11);
    Output::operator<<((Output *)local_4038,(char **)&local_4090);
  }
  Output::~Output((Output *)local_4038);
  return;
LAB_00141ad8:
  bVar1 = (byte)ptVar14->tv_sec;
  if (bVar1 < 0x20) {
    if (bVar1 == 0) goto LAB_00141b0c;
    if ((bVar1 == 10) || (bVar1 == 0xd)) goto LAB_00141b09;
LAB_00141af5:
    iVar8 = isspace((int)(char)bVar1);
    if (iVar8 != 0) {
      *(char *)&ptVar14->tv_sec = ' ';
    }
  }
  else if (bVar1 != 0x20) goto LAB_00141af5;
  ptVar14 = (timeval *)((long)&ptVar14->tv_sec + 1);
  goto LAB_00141ad8;
LAB_00141b09:
  *(char *)&ptVar14->tv_sec = '\0';
LAB_00141b0c:
  if ((timeval *)local_4090.tv_sec != (timeval *)0x0) {
    cVar15 = (char)*(__time_t *)local_4090.tv_sec;
    while (cVar15 != '\0') {
      pcVar10 = (char *)((long)&((timeval *)local_4090.tv_sec)->tv_sec + 1);
      iVar8 = isspace((int)cVar15);
      if (iVar8 == 0) break;
      local_4090.tv_sec = (__time_t)pcVar10;
      cVar15 = *pcVar10;
    }
  }
LAB_00141b40:
  iVar8 = (*((this->super_BackgroundCommand).engine)->_vptr_ChessEngine[9])();
  ptVar14 = (timeval *)CONCAT44(extraout_var,iVar8);
  local_4090.tv_sec = (__time_t)ptVar14;
  if (ptVar14 == (timeval *)0x0) goto LAB_00141c85;
  cVar15 = (char)ptVar14->tv_sec;
  while (local_4090.tv_sec = (__time_t)ptVar14, cVar15 != '\0') {
    pcVar10 = strchr((char *)ptVar14,0x3b);
    if (pcVar10 == (char *)0x0) {
LAB_00141b94:
      do {
        puVar3 = (undefined1 *)((long)&ptVar14->tv_sec + 1);
        iVar8 = isspace((int)cVar15);
        if (iVar8 == 0) {
          if ((cVar15 == 'D') && ((int)(char)*puVar3 - 0x30U < 10)) {
            bVar6 = Process(this,(char *)ptVar14,&local_4068,&local_4070,&local_4060);
            if (pcVar10 != (char *)0x0 && bVar6) goto LAB_00141bf5;
            bVar6 = !bVar6;
            goto LAB_00141c0b;
          }
          break;
        }
        cVar15 = *puVar3;
        ptVar14 = (timeval *)puVar3;
        local_4090.tv_sec = (__time_t)puVar3;
      } while (cVar15 != '\0');
      if (pcVar10 == (char *)0x0) break;
    }
    else {
      *pcVar10 = '\0';
      cVar15 = (char)*(__time_t *)local_4090.tv_sec;
      ptVar14 = (timeval *)local_4090.tv_sec;
      if (cVar15 != '\0') goto LAB_00141b94;
    }
LAB_00141bf5:
    ptVar14 = (timeval *)(pcVar10 + 1);
    cVar15 = pcVar10[1];
  }
  bVar6 = false;
LAB_00141c0b:
  pFVar9 = local_4080;
  iVar8 = iVar7;
  if (this->count <= iVar7 && 0 < this->count) goto LAB_00141c85;
LAB_00141a29:
  iVar13 = iVar13 + 1;
  if (bVar6) {
LAB_00141c85:
    gettimeofday(&local_4090,(__timezone_ptr_t)0x0);
    lVar12 = (local_4090.tv_sec - local_4040) * 1000 + local_4090.tv_usec / 1000 + (long)local_4058;
    uVar21 = (undefined4)((ulong)lVar12 >> 0x20);
    if (this->qperft == true) {
      Output::Output((Output *)&local_4090,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total QPerft ",0xd);
      uVar4 = local_4068;
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_4078._vptr_Output._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)&local_4078,1);
      pFVar9 = local_4080;
      dVar16 = 0.0;
      if (lVar12 != 0) {
        auVar18._8_4_ = uVar21;
        auVar18._0_8_ = lVar12;
        auVar18._12_4_ = 0x45300000;
        dVar16 = ((double)(uVar4 / 1000) /
                 ((auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0))) * 1000.0;
      }
      std::ostream::_M_insert<double>(dVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," KNodes/sec",0xb);
      Output::~Output((Output *)&local_4090);
      Output::Output((Output *)&local_4090,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total Snodes ",0xd);
      uVar5 = local_4060;
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", Qnodes ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
      dVar16 = 0.0;
      if (uVar4 != 0) {
        auVar19._8_4_ = (int)(uVar5 >> 0x20);
        auVar19._0_8_ = uVar5;
        auVar19._12_4_ = 0x45300000;
        auVar20._8_4_ = (int)(uVar4 >> 0x20);
        auVar20._0_8_ = uVar4;
        auVar20._12_4_ = 0x45300000;
        dVar16 = (((auVar19._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) /
                 ((auVar20._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0))) * 100.0;
      }
      std::ostream::_M_insert<double>(dVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%)",2);
    }
    else {
      Output::Output((Output *)&local_4090,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total Perft ",0xc);
      uVar4 = local_4068;
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_4078._vptr_Output._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)&local_4078,1);
      auVar17._8_4_ = uVar21;
      auVar17._0_8_ = lVar12;
      auVar17._12_4_ = 0x45300000;
      dStack_4050 = auVar17._8_8_ - 1.9342813113834067e+25;
      local_4058 = dStack_4050 + ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0);
      dVar16 = 0.0;
      if (lVar12 != 0) {
        dVar16 = ((double)(uVar4 / 1000) / local_4058) * 1000.0;
      }
      std::ostream::_M_insert<double>(dVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," KLeafs/sec",0xb);
      Output::~Output((Output *)&local_4090);
      Output::Output((Output *)&local_4090,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total Nodes ",0xc);
      uVar4 = local_4070;
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_4078._vptr_Output._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)&local_4078,1);
      pFVar9 = local_4080;
      dVar16 = 0.0;
      if (lVar12 != 0) {
        dVar16 = ((double)(uVar4 / 1000) / local_4058) * 1000.0;
      }
      std::ostream::_M_insert<double>(dVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," KNodes/sec",0xb);
    }
    Output::~Output((Output *)&local_4090);
    if (pFVar9 == (FILE *)0x0) {
      return;
    }
    fclose(pFVar9);
    return;
  }
  goto LAB_001419c5;
}

Assistant:

void PerftCommandHandle::Execute()
{
  if (!engine) {
    Output() << "Engine not set for '" << command << "' command";
    return;
  }

  engine->ClearStopFlags();

  if (fileName.empty()) {
    if (qperft) {
      engine->QPerft(maxDepth);
    }
    else {
      engine->Perft(maxDepth);
    }
    return;
  }

  FILE* fp = NULL;
  try {
    if (!(fp = fopen(fileName.c_str(), "r"))) {
      Output() << "Cannot open '" << fileName << "': " << strerror(errno);
      return;
    }

    const uint64_t start = Now();
    uint64_t pcount = 0;
    uint64_t nodes = 0;
    uint64_t qnodes = 0;
    bool done = false;
    char fen[16384];
    int positions = 0;

    for (int line = 1; !done && fgets(fen, sizeof(fen), fp); ++line) {
      char* f = fen;
      if (!*NextWord(f) || (*f == '#')) {
        continue;
      }

      positions++;
      if ((skip > 0) && (positions <= skip)) {
        continue;
      }

      Output() << fileName << " line " << line << ' ' << f;
      NormalizeString(f);
      if (!(f = const_cast<char*>(engine->SetPosition(f)))) {
        break;
      }

      while (f && *f) {
        // null terminate this parameter (parameters end with ; or end of line)
        char* end = strchr(f, ';');
        if (end) {
          *end = 0;
        }

        // process "D<depth> <leafs>" parameters (e.g. D5 4865609)
        if ((*NextWord(f) == 'D') && isdigit(f[1])) {
          if (!Process(f, pcount, nodes, qnodes)) {
            done = true;
            break;
          }
        }

        // move 'f' to beginning of next parameter
        if (end) {
          f = (end + 1);
          continue;
        }
        break;
      }

      if ((count > 0) && (positions >= count)) {
        break;
      }
    }

    const uint64_t time = (Now() - start);
    if (qperft) {
      Output() << "Total QPerft " << pcount << ' '
               << Rate((pcount / 1000), time) << " KNodes/sec";
      Output() << "Total Snodes " << (nodes - qnodes) << ", Qnodes " << qnodes
               << " (" << Percent(qnodes, pcount) << "%)";
    }
    else {
      Output() << "Total Perft " << pcount << ' '
               << Rate((pcount / 1000), time) << " KLeafs/sec";
      Output() << "Total Nodes " << nodes << ' '
               << Rate((nodes / 1000), time) << " KNodes/sec";
    }
  }
  catch (const std::exception& e) {
    Output() << "ERROR: " << e.what();
  }
  catch (...) {
    Output() << "Unknown error!";
  }

  if (fp) {
    fclose(fp);
    fp = NULL;
  }
}